

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O1

bool __thiscall
Fossilize::ExternalReplayer::Impl::is_process_complete(Impl *this,int *return_status)

{
  bool bVar1;
  __pid_t _Var2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  Progress progress;
  Progress local_88;
  
  if (this->pid == -1) {
    bVar1 = true;
    if (return_status != (int *)0x0) {
      uVar4 = this->wstatus;
      if (this->synthesized_exit_code == false) {
        uVar5 = uVar4 & 0x7f;
        if (uVar5 == 0) {
          uVar4 = uVar4 >> 8 & 0xff;
        }
        else {
          uVar4 = 0;
          if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
            uVar4 = -uVar5;
          }
        }
      }
      *return_status = uVar4;
    }
  }
  else {
    _Var2 = waitpid(this->pid,&this->wstatus,1);
    if ((_Var2 == 0) ||
       (((0 < _Var2 && (uVar4 = this->wstatus & 0x7f, uVar4 != 0)) &&
        ((int)(uVar4 * 0x1000000 + 0x1000000) < 0x2000000)))) {
      bVar1 = false;
    }
    else {
      if (_Var2 < 0) {
        piVar3 = __errno_location();
        this->wstatus = -*piVar3;
        this->synthesized_exit_code = true;
      }
      local_88.dirty_crashes = 0;
      local_88.total_graphics_pipeline_blobs = 0;
      local_88.total_compute_pipeline_blobs = 0;
      local_88.total_raytracing_pipeline_blobs = 0;
      local_88.total_modules = 0;
      local_88.banned_modules = 0;
      local_88.module_validation_failures = 0;
      local_88.clean_crashes = 0;
      local_88.raytracing.cached = 0;
      local_88.raytracing.total = 0;
      local_88.completed_modules = 0;
      local_88.missing_modules = 0;
      local_88.raytracing.parsed = 0;
      local_88.raytracing.parsed_fail = 0;
      local_88.raytracing.completed = 0;
      local_88.raytracing.skipped = 0;
      local_88.graphics.completed = 0;
      local_88.graphics.skipped = 0;
      local_88.graphics.cached = 0;
      local_88.graphics.total = 0;
      local_88.compute.cached = 0;
      local_88.compute.total = 0;
      local_88.graphics.parsed = 0;
      local_88.graphics.parsed_fail = 0;
      local_88.compute.parsed = 0;
      local_88.compute.parsed_fail = 0;
      local_88.compute.completed = 0;
      local_88.compute.skipped = 0;
      poll_progress(this,&local_88);
      reset_pid(this);
      if (return_status != (int *)0x0) {
        uVar4 = this->wstatus;
        if (this->synthesized_exit_code == false) {
          uVar5 = uVar4 & 0x7f;
          if (uVar5 == 0) {
            uVar4 = uVar4 >> 8 & 0xff;
          }
          else {
            uVar4 = 0;
            if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
              uVar4 = -uVar5;
            }
          }
        }
        *return_status = uVar4;
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool ExternalReplayer::Impl::is_process_complete(int *return_status)
{
	if (pid == -1)
	{
		if (return_status)
			*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
		return true;
	}

	int ret;
	if ((ret = waitpid(pid, &wstatus, WNOHANG)) == 0)
		return false;

	// Child process can receive SIGCONT/SIGSTOP which is benign.
	if (ret > 0 && !WIFEXITED(wstatus) && !WIFSIGNALED(wstatus))
		return false;

	if (ret < 0)
	{
		// If we error out here, we will not be able to receive a functioning return code, so
		// just return -errno.
		wstatus = -errno;
		synthesized_exit_code = true;
	}

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

	reset_pid();

	if (return_status)
		*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
	return true;
}